

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

ssize_t __thiscall r_comp::Compiler::read(Compiler *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  Iteration IVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  size_t __nbytes_00;
  void *__buf_00;
  void *__buf_01;
  long extraout_RDX;
  long extraout_RDX_00;
  int __fd_00;
  undefined4 in_register_00000034;
  StructureMember *pSVar4;
  uint in_R8D;
  undefined8 in_R9;
  byte in_stack_00000008;
  code *local_e0;
  code *local_b0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  Class *local_48;
  Class *p;
  undefined8 uStack_38;
  bool write_local;
  uint16_t *extent_index_local;
  uint16_t write_index_local;
  StructureMember *pSStack_28;
  bool enforce_local;
  StructureMember *m_local;
  Ptr *node_local;
  Compiler *this_local;
  Metadata *metadata;
  
  pSVar4 = (StructureMember *)CONCAT44(in_register_00000034,__fd);
  __nbytes_00 = (size_t)in_R8D;
  extent_index_local._7_1_ = (byte)__nbytes & 1;
  extent_index_local._4_2_ = (undefined2)in_R8D;
  p._7_1_ = in_stack_00000008 & 1;
  metadata = this->_metadata;
  uStack_38 = in_R9;
  pSStack_28 = (StructureMember *)__buf;
  m_local = pSVar4;
  node_local = (Ptr *)this;
  local_48 = StructureMember::get_class((StructureMember *)__buf,metadata);
  __fd_00 = (int)metadata;
  if (local_48 == (Class *)0x0) {
    local_e0 = (code *)StructureMember::read(pSStack_28,__fd_00,__buf_00,__nbytes_00);
    if (((ulong)local_e0 & 1) != 0) {
      local_e0 = *(code **)(local_e0 + *(long *)(&this->error + extraout_RDX_00) + -1);
    }
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              (local_78,(shared_ptr<r_comp::RepliStruct> *)pSVar4);
    bVar1 = (*local_e0)(&this->error + extraout_RDX_00,local_78,extent_index_local._7_1_ & 1,0,
                        extent_index_local._4_2_,uStack_38,p._7_1_ & 1);
    this_local._7_1_ = bVar1 & 1;
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    uVar3 = extraout_RAX_00;
  }
  else {
    IVar2 = StructureMember::getIteration(pSStack_28);
    local_48->use_as = IVar2;
    local_b0 = (code *)StructureMember::read(pSStack_28,__fd_00,__buf_01,(ulong)IVar2);
    if (((ulong)local_b0 & 1) != 0) {
      local_b0 = *(code **)(local_b0 + *(long *)(&this->error + extraout_RDX) + -1);
    }
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              (&local_58,(shared_ptr<r_comp::RepliStruct> *)pSVar4);
    bVar1 = (*local_b0)(&this->error + extraout_RDX,&local_58,extent_index_local._7_1_ & 1,local_48,
                        extent_index_local._4_2_,uStack_38,p._7_1_ & 1);
    this_local._7_1_ = bVar1 & 1;
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
    uVar3 = extraout_RAX;
  }
  return CONCAT71((int7)((ulong)uVar3 >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

bool Compiler::read(RepliStruct::Ptr node, const StructureMember &m, bool enforce, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (Class *p = m.get_class(_metadata)) {
        p->use_as = m.getIteration();
        return (this->*m.read())(node, enforce, p, write_index, extent_index, write);
    }

    return (this->*m.read())(node, enforce, nullptr, write_index, extent_index, write);
}